

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O0

void __thiscall
spdlog::details::file_helper::file_helper(file_helper *this,file_event_handlers *event_handlers)

{
  file_event_handlers *in_RDI;
  file_event_handlers *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  *(undefined4 *)&(in_RDI->before_open).super__Function_base._M_functor = 5;
  *(undefined4 *)((long)&(in_RDI->before_open).super__Function_base._M_functor + 4) = 10;
  *(undefined8 *)((long)&(in_RDI->before_open).super__Function_base._M_functor + 8) = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffffe0);
  file_event_handlers::file_event_handlers(unaff_retaddr,in_RDI);
  return;
}

Assistant:

SPDLOG_INLINE file_helper::file_helper(const file_event_handlers &event_handlers)
    : event_handlers_(event_handlers) {}